

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea_io.c
# Opt level: O0

int CVodeGetAdjDataPointHermite(void *cvode_mem,int which,sunrealtype *t,N_Vector y,N_Vector yd)

{
  CVdtpntMemRec **ppCVar1;
  undefined8 *puVar2;
  long in_RCX;
  sunrealtype *in_RDX;
  int in_ESI;
  CVodeMem in_RDI;
  long in_R8;
  CVhermiteDataMem content;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x2b0,"CVodeGetAdjDataPointHermite",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_adjMallocDone == 0) {
    cvProcessError(in_RDI,-0x65,0x2b8,"CVodeGetAdjDataPointHermite",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                   ,"Illegal attempt to call before calling CVodeAdjMalloc.");
    local_4 = -0x65;
  }
  else {
    ppCVar1 = in_RDI->cv_adj_mem->dt_mem;
    if (in_RDI->cv_adj_mem->ca_IMtype == 1) {
      *in_RDX = ppCVar1[in_ESI]->t;
      puVar2 = (undefined8 *)ppCVar1[in_ESI]->content;
      if (in_RCX != 0) {
        N_VScale(0x3ff0000000000000,*puVar2,in_RCX);
      }
      if (in_R8 != 0) {
        N_VScale(0x3ff0000000000000,puVar2[1],in_R8);
      }
      local_4 = 0;
    }
    else {
      cvProcessError(in_RDI,-0x16,0x2c1,"CVodeGetAdjDataPointHermite",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodea_io.c"
                     ,"This function cannot be called for the specified interp type.");
      local_4 = -0x16;
    }
  }
  return local_4;
}

Assistant:

int CVodeGetAdjDataPointHermite(void* cvode_mem, int which, sunrealtype* t,
                                N_Vector y, N_Vector yd)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVhermiteDataMem content;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_ADJ, __LINE__, __func__, __FILE__, MSGCV_NO_ADJ);
    return (CV_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  dt_mem = ca_mem->dt_mem;

  if (ca_mem->ca_IMtype != CV_HERMITE)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_WRONG_INTERP);
    return (CV_ILL_INPUT);
  }

  *t = dt_mem[which]->t;

  content = (CVhermiteDataMem)(dt_mem[which]->content);

  if (y != NULL) { N_VScale(ONE, content->y, y); }

  if (yd != NULL) { N_VScale(ONE, content->yd, yd); }

  return (CV_SUCCESS);
}